

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastErP1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  anon_class_40_5_b7277c77 add;
  TcParseTableBase *this;
  ParseContext *ctx_00;
  MessageLite *pMVar1;
  uchar uVar2;
  byte bVar3;
  uint16_t uVar4;
  uint uVar5;
  char *pcVar6;
  uint *puVar7;
  RepeatedField<int> *pRVar8;
  FieldAux *pFVar9;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  undefined7 uStack_a7;
  FieldAux aux;
  RepeatedField<int> *field;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_78;
  uchar saved_tag;
  uint64_t local_70;
  TcParseTableBase *local_68;
  ParseContext *local_60;
  char *local_58;
  MessageLite *local_50;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_48 [2];
  uint local_34;
  TcParseTableBase *pTStack_30;
  uint32_t has_bits_offset;
  uint64_t local_28;
  MessageLite *local_20;
  undefined2 local_12;
  void *local_10;
  
  local_70 = hasbits;
  local_68 = table;
  local_60 = ctx;
  local_58 = ptr;
  local_50 = msg;
  local_48[0] = data.field_0;
  uVar2 = TcFieldData::coded_tag<unsigned_char>((TcFieldData *)local_48);
  pMVar1 = local_50;
  pcVar6 = local_58;
  ctx_00 = local_60;
  if (uVar2 != '\0') {
    TcFieldData::TcFieldData((TcFieldData *)&stack0xffffffffffffff88);
    pcVar6 = MiniParse(pMVar1,pcVar6,ctx_00,(TcFieldData)aStack_78,local_68,local_70);
    return pcVar6;
  }
  uVar2 = UnalignedLoad<unsigned_char>(local_58);
  local_58 = local_58 + 1;
  local_20 = local_50;
  local_28 = local_70;
  pTStack_30 = local_68;
  local_34 = (uint)local_68->has_bits_offset;
  if (local_34 != 0) {
    uVar5 = (uint)local_70;
    puVar7 = RefAt<unsigned_int>(local_50,(ulong)local_34);
    *puVar7 = uVar5 | *puVar7;
  }
  pMVar1 = local_50;
  uVar4 = TcFieldData::offset((TcFieldData *)local_48);
  pRVar8 = RefAt<google::protobuf::RepeatedField<int>>(pMVar1,(ulong)uVar4);
  this = local_68;
  bVar3 = TcFieldData::aux_idx((TcFieldData *)local_48);
  pFVar9 = TcParseTableBase::field_aux(this,(uint)bVar3);
  local_10 = pFVar9->message_default_p;
  local_12 = 0x600;
  add._25_7_ = uStack_a7;
  add.saved_tag = uVar2;
  add.msg = local_50;
  add.aux.message_default_p = local_10;
  add.table = local_68;
  add.field = pRVar8;
  pcVar6 = EpsCopyInputStream::
           ReadPackedVarint<google::protobuf::internal::TcParser::PackedEnum<unsigned_char,(unsigned_short)1536>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(int)_1_>
                     (&local_60->super_EpsCopyInputStream,local_58,add);
  return pcVar6;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastErP1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return PackedEnum<uint8_t, field_layout::kTvRange>(
      PROTOBUF_TC_PARAM_PASS);
}